

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O1

int anon_unknown.dwarf_2f::AsyncBioMethodType(void)

{
  int iVar1;
  uint uVar2;
  
  if ((anonymous_namespace)::AsyncBioMethodType()::type == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::AsyncBioMethodType()::type);
    if (iVar1 != 0) {
      uVar2 = BIO_get_new_index();
      if ((int)uVar2 < 1) {
        abort();
      }
      AsyncBioMethodType::type = uVar2 | 0x200;
      __cxa_guard_release(&(anonymous_namespace)::AsyncBioMethodType()::type);
    }
  }
  return AsyncBioMethodType::type;
}

Assistant:

static int AsyncBioMethodType() {
  static int type = [] {
    int idx = BIO_get_new_index();
    BSSL_CHECK(idx > 0);
    return idx | BIO_TYPE_FILTER;
  }();
  return type;
}